

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_TypeChecker.cpp
# Opt level: O2

void __thiscall
psy::C::TypeChecker::DiagnosticsReporter::diagnose
          (DiagnosticsReporter *this,DiagnosticDescriptor *desc,SyntaxToken *tk)

{
  SyntaxTree *this_00;
  SyntaxToken local_b8;
  DiagnosticDescriptor local_80;
  
  this_00 = (this->tyChecker_->super_SyntaxVisitor).tree_;
  DiagnosticDescriptor::DiagnosticDescriptor(&local_80,desc);
  local_b8.field_10 = tk->field_10;
  local_b8.tree_ = tk->tree_;
  local_b8.syntaxK_ = tk->syntaxK_;
  local_b8.byteSize_ = tk->byteSize_;
  local_b8.charSize_ = tk->charSize_;
  local_b8._14_2_ = *(undefined2 *)&tk->field_0xe;
  local_b8.byteOffset_ = tk->byteOffset_;
  local_b8.charOffset_ = tk->charOffset_;
  local_b8.matchingBracket_ = tk->matchingBracket_;
  local_b8.field_7 = tk->field_7;
  local_b8._34_2_ = *(undefined2 *)&tk->field_0x22;
  local_b8.lineno_ = tk->lineno_;
  local_b8.column_ = tk->column_;
  local_b8._44_4_ = *(undefined4 *)&tk->field_0x2c;
  SyntaxTree::newDiagnostic(this_00,&local_80,&local_b8);
  SyntaxToken::~SyntaxToken(&local_b8);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_80);
  return;
}

Assistant:

void TypeChecker::DiagnosticsReporter::diagnose(DiagnosticDescriptor&& desc, SyntaxToken tk)
{
    tyChecker_->tree_->newDiagnostic(desc, tk);
}